

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O3

void __thiscall Assimp::ColladaExporter::WriteMaterials(ColladaExporter *this)

{
  undefined1 *puVar1;
  Surface *pSurface;
  string *name_00;
  Surface *pSurface_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  aiMaterial *pMat;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  pointer pcVar9;
  aiReturn aVar10;
  int iVar11;
  aiScene *paVar12;
  undefined8 *puVar13;
  size_t sVar14;
  long *plVar15;
  ostream *poVar16;
  long *plVar17;
  char *pcVar18;
  char *pcVar19;
  long lVar20;
  long lVar21;
  vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  *this_00;
  ulong uVar22;
  string *psVar23;
  long lVar24;
  Property *pProperty;
  ulong uVar25;
  pointer pMVar26;
  string testName;
  aiString name;
  aiMaterialProperty *prop;
  long local_678;
  ulong *local_660;
  long local_658;
  ulong local_650 [2];
  long *local_640;
  undefined8 local_638;
  long local_630;
  undefined8 uStack_628;
  ulong *local_620;
  long local_618;
  ulong local_610 [2];
  long *local_600;
  size_t local_5f8;
  long local_5f0;
  long lStack_5e8;
  ColladaExporter *local_5e0;
  Surface *local_5d8;
  Surface *local_5d0;
  Surface *local_5c8;
  Surface *local_5c0;
  Surface *local_5b8;
  undefined1 local_5b0 [1032];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  this_00 = &this->materials;
  std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  ::resize(this_00,(ulong)this->mScene->mNumMaterials);
  paVar12 = this->mScene;
  if (paVar12->mNumMaterials != 0) {
    local_678 = 0;
    lVar21 = 0;
    uVar25 = 0;
    local_5e0 = this;
    do {
      pMat = paVar12->mMaterials[uVar25];
      local_5b0._0_8_ = local_5b0._0_8_ & 0xffffff0000000000;
      memset(local_5b0 + 5,0x1b,0x3ff);
      aVar10 = aiGetMaterialString(pMat,"?mat.name",0,0,(aiString *)local_5b0);
      if (aVar10 == aiReturn_SUCCESS) {
        pcVar19 = local_5b0 + 4;
        local_600 = &local_5f0;
        sVar14 = strlen(pcVar19);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_600,pcVar19,pcVar19 + sVar14);
        sVar14 = local_5f8;
        plVar15 = local_600;
        if (uVar25 == 0) {
LAB_0030e1df:
          pMVar26 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pcVar19 = (char *)pMVar26[uVar25].name._M_string_length;
          strlen(local_5b0 + 4);
          std::__cxx11::string::_M_replace
                    ((ulong)(pMVar26 + uVar25),0,pcVar19,(ulong)(local_5b0 + 4));
        }
        else {
          pMVar26 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar20 = 0;
          lVar24 = 0;
          do {
            if (*(size_t *)((long)&(pMVar26->name)._M_string_length + lVar20) == sVar14) {
              if (sVar14 == 0) {
                lVar24 = lVar24 + 1;
              }
              else {
                iVar11 = bcmp(*(void **)((long)&(pMVar26->name)._M_dataplus._M_p + lVar20),plVar15,
                              sVar14);
                lVar24 = lVar24 + (ulong)(iVar11 == 0);
              }
            }
            this = local_5e0;
            lVar20 = lVar20 + 0x218;
          } while (local_678 != lVar20);
          if (lVar24 == 0) goto LAB_0030e1df;
          pcVar19 = local_5b0 + 4;
          local_660 = local_650;
          sVar14 = strlen(pcVar19);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_660,pcVar19,pcVar19 + sVar14);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          uVar22 = 0xf;
          if (local_660 != local_650) {
            uVar22 = local_650[0];
          }
          if (uVar22 < (ulong)(local_618 + local_658)) {
            uVar22 = 0xf;
            if (local_620 != local_610) {
              uVar22 = local_610[0];
            }
            if (uVar22 < (ulong)(local_618 + local_658)) goto LAB_0030e1d0;
            puVar13 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_620,0,(char *)0x0,(ulong)local_660);
          }
          else {
LAB_0030e1d0:
            puVar13 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_660,(ulong)local_620);
          }
          plVar15 = puVar13 + 2;
          if ((long *)*puVar13 == plVar15) {
            local_630 = *plVar15;
            uStack_628 = puVar13[3];
            local_640 = &local_630;
          }
          else {
            local_630 = *plVar15;
            local_640 = (long *)*puVar13;
          }
          local_638 = puVar13[1];
          *puVar13 = plVar15;
          puVar13[1] = 0;
          *(undefined1 *)plVar15 = 0;
          std::__cxx11::string::operator=
                    ((string *)
                     ((this_00->
                      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar25),(string *)&local_640);
          if (local_640 != &local_630) {
            operator_delete(local_640,local_630 + 1);
          }
          if (local_620 != local_610) {
            operator_delete(local_620,local_610[0] + 1);
          }
          if (local_660 != local_650) {
            operator_delete(local_660,local_650[0] + 1);
          }
        }
        if (local_600 != &local_5f0) {
          operator_delete(local_600,local_5f0 + 1);
        }
      }
      else {
        local_5b0._0_8_ = (char *)0x74616d00000003;
        local_660 = local_650;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"m","");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar22 = 0xf;
        if (local_660 != local_650) {
          uVar22 = local_650[0];
        }
        if (uVar22 < (ulong)(local_618 + local_658)) {
          uVar22 = 0xf;
          if (local_620 != local_610) {
            uVar22 = local_610[0];
          }
          if (uVar22 < (ulong)(local_618 + local_658)) goto LAB_0030e052;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_620,0,(char *)0x0,(ulong)local_660);
        }
        else {
LAB_0030e052:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_660,(ulong)local_620);
        }
        plVar15 = puVar13 + 2;
        if ((long *)*puVar13 == plVar15) {
          local_630 = *plVar15;
          uStack_628 = puVar13[3];
          local_640 = &local_630;
        }
        else {
          local_630 = *plVar15;
          local_640 = (long *)*puVar13;
        }
        local_638 = puVar13[1];
        *puVar13 = plVar15;
        puVar13[1] = 0;
        *(undefined1 *)plVar15 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_640);
        plVar17 = plVar15 + 2;
        if ((long *)*plVar15 == plVar17) {
          local_5f0 = *plVar17;
          lStack_5e8 = plVar15[3];
          local_600 = &local_5f0;
        }
        else {
          local_5f0 = *plVar17;
          local_600 = (long *)*plVar15;
        }
        local_5f8 = plVar15[1];
        *plVar15 = (long)plVar17;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::operator=
                  ((string *)
                   ((this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar25),(string *)&local_600);
        if (local_600 != &local_5f0) {
          operator_delete(local_600,local_5f0 + 1);
        }
        if (local_640 != &local_630) {
          operator_delete(local_640,local_630 + 1);
        }
        if (local_620 != local_610) {
          operator_delete(local_620,local_610[0] + 1);
        }
        if (local_660 != local_650) {
          operator_delete(local_660,local_650[0] + 1);
        }
      }
      pMVar26 = (this_00->
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::_M_replace
                ((ulong)&pMVar26[uVar25].shading_model,0,
                 (char *)pMVar26[uVar25].shading_model._M_string_length,0x6f1885);
      aVar10 = aiGetMaterialProperty(pMat,"$mat.shadingm",0,0,(aiMaterialProperty **)local_1a8);
      if (((aVar10 == aiReturn_SUCCESS) && (3 < *(uint *)(local_1a8[0]._M_dataplus._M_p + 0x40c)))
         && (*(int *)(local_1a8[0]._M_dataplus._M_p + 0x410) == 5)) {
        switch(**(undefined4 **)(local_1a8[0]._M_dataplus._M_p + 0x418)) {
        case 2:
          pMVar26 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          psVar23 = &pMVar26[uVar25].shading_model;
          pcVar19 = (char *)pMVar26[uVar25].shading_model._M_string_length;
          pcVar18 = "lambert";
          break;
        case 3:
          pMVar26 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          psVar23 = &pMVar26[uVar25].shading_model;
          pcVar19 = (char *)pMVar26[uVar25].shading_model._M_string_length;
          pcVar18 = "phong";
          break;
        case 4:
          pMVar26 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          psVar23 = &pMVar26[uVar25].shading_model;
          pcVar19 = (char *)pMVar26[uVar25].shading_model._M_string_length;
          pcVar18 = "blinn";
          break;
        default:
          goto switchD_0030e4e4_caseD_5;
        case 9:
          pMVar26 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          psVar23 = &pMVar26[uVar25].shading_model;
          pcVar19 = (char *)pMVar26[uVar25].shading_model._M_string_length;
          pcVar18 = "constant";
        }
        std::__cxx11::string::_M_replace((ulong)psVar23,0,pcVar19,(ulong)pcVar18);
      }
switchD_0030e4e4_caseD_5:
      ReadMaterialSurface(this,&(this->materials).
                                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar25].ambient,pMat,
                          aiTextureType_AMBIENT,"$clr.ambient",0,0);
      pMVar26 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar3 = pMVar26[uVar25].ambient.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar26[uVar25].diffuse,pMat,aiTextureType_DIFFUSE,"$clr.diffuse",0,
                          0);
      pMVar26 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar4 = pMVar26[uVar25].diffuse.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar26[uVar25].specular,pMat,aiTextureType_SPECULAR,"$clr.specular"
                          ,0,0);
      pMVar26 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar5 = pMVar26[uVar25].specular.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar26[uVar25].emissive,pMat,aiTextureType_EMISSIVE,"$clr.emissive"
                          ,0,0);
      pMVar26 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar6 = pMVar26[uVar25].emissive.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar26[uVar25].reflective,pMat,aiTextureType_REFLECTION,
                          "$clr.reflective",0,0);
      pMVar26 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar7 = pMVar26[uVar25].reflective.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar26[uVar25].transparent,pMat,aiTextureType_OPACITY,
                          "$clr.transparent",0,0);
      pMVar26 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar8 = pMVar26[uVar25].transparent.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar26[uVar25].normal,pMat,aiTextureType_NORMALS,(char *)0x0,0,0);
      pMVar26 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar21 = (((((((lVar21 - (ulong)(sVar3 == 0)) - (ulong)(sVar4 == 0)) - (ulong)(sVar5 == 0)) -
                  (ulong)(sVar6 == 0)) - (ulong)(sVar7 == 0)) - (ulong)(sVar8 == 0)) + 7) -
               (ulong)(pMVar26[uVar25].normal.texture._M_string_length == 0);
      aVar10 = aiGetMaterialFloatArray
                         (pMat,"$mat.shininess",0,0,&pMVar26[uVar25].shininess.value,(uint *)0x0);
      (this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar25].shininess.exist = aVar10 == aiReturn_SUCCESS
      ;
      aVar10 = aiGetMaterialFloatArray
                         (pMat,"$mat.opacity",0,0,
                          &(this->materials).
                           super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar25].transparency.value,
                          (uint *)0x0);
      (this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar25].transparency.exist =
           aVar10 == aiReturn_SUCCESS;
      aVar10 = aiGetMaterialFloatArray
                         (pMat,"$mat.refracti",0,0,
                          &(this->materials).
                           super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar25].index_refraction.value,
                          (uint *)0x0);
      (this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar25].index_refraction.exist =
           aVar10 == aiReturn_SUCCESS;
      uVar25 = uVar25 + 1;
      paVar12 = this->mScene;
      local_678 = local_678 + 0x218;
    } while (uVar25 < paVar12->mNumMaterials);
    if (lVar21 != 0) {
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&this->field_0x38,(this->startstr)._M_dataplus._M_p,
                           (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"<library_images>",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      std::__cxx11::string::append((char *)&this->startstr);
      pMVar26 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pMVar26 !=
          (this->materials).
          super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar19 = local_5b0 + 0x10;
        do {
          pcVar9 = (pMVar26->name)._M_dataplus._M_p;
          local_5b0._0_8_ = pcVar19;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5b0,pcVar9,pcVar9 + (pMVar26->name)._M_string_length);
          std::__cxx11::string::append((char *)local_5b0);
          WriteImageEntry(this,&pMVar26->ambient,(string *)local_5b0);
          if ((char *)local_5b0._0_8_ != pcVar19) {
            operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
          }
          pcVar9 = (pMVar26->name)._M_dataplus._M_p;
          local_5b0._0_8_ = pcVar19;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5b0,pcVar9,pcVar9 + (pMVar26->name)._M_string_length);
          std::__cxx11::string::append((char *)local_5b0);
          WriteImageEntry(this,&pMVar26->diffuse,(string *)local_5b0);
          if ((char *)local_5b0._0_8_ != pcVar19) {
            operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
          }
          pcVar9 = (pMVar26->name)._M_dataplus._M_p;
          local_5b0._0_8_ = pcVar19;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5b0,pcVar9,pcVar9 + (pMVar26->name)._M_string_length);
          std::__cxx11::string::append((char *)local_5b0);
          WriteImageEntry(this,&pMVar26->specular,(string *)local_5b0);
          if ((char *)local_5b0._0_8_ != pcVar19) {
            operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
          }
          pcVar9 = (pMVar26->name)._M_dataplus._M_p;
          local_5b0._0_8_ = pcVar19;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5b0,pcVar9,pcVar9 + (pMVar26->name)._M_string_length);
          std::__cxx11::string::append((char *)local_5b0);
          WriteImageEntry(this,&pMVar26->emissive,(string *)local_5b0);
          if ((char *)local_5b0._0_8_ != pcVar19) {
            operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
          }
          pcVar9 = (pMVar26->name)._M_dataplus._M_p;
          local_5b0._0_8_ = pcVar19;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5b0,pcVar9,pcVar9 + (pMVar26->name)._M_string_length);
          std::__cxx11::string::append((char *)local_5b0);
          WriteImageEntry(this,&pMVar26->reflective,(string *)local_5b0);
          if ((char *)local_5b0._0_8_ != pcVar19) {
            operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
          }
          pcVar9 = (pMVar26->name)._M_dataplus._M_p;
          local_5b0._0_8_ = pcVar19;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5b0,pcVar9,pcVar9 + (pMVar26->name)._M_string_length);
          std::__cxx11::string::append((char *)local_5b0);
          WriteImageEntry(this,&pMVar26->transparent,(string *)local_5b0);
          if ((char *)local_5b0._0_8_ != pcVar19) {
            operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
          }
          pcVar9 = (pMVar26->name)._M_dataplus._M_p;
          local_5b0._0_8_ = pcVar19;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5b0,pcVar9,pcVar9 + (pMVar26->name)._M_string_length);
          std::__cxx11::string::append((char *)local_5b0);
          WriteImageEntry(this,&pMVar26->normal,(string *)local_5b0);
          if ((char *)local_5b0._0_8_ != pcVar19) {
            operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
          }
          pMVar26 = pMVar26 + 1;
        } while (pMVar26 !=
                 (this->materials).
                 super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      PopTag(this);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&this->field_0x38,(this->startstr)._M_dataplus._M_p,
                           (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"</library_images>",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    }
  }
  if ((this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar1 = &this->field_0x38;
    psVar23 = &this->startstr;
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                         (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"<library_effects>",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    std::__cxx11::string::append((char *)psVar23);
    pMVar26 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pMVar26 !=
        (this->materials).
        super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pProperty = &pMVar26->index_refraction;
      do {
        name_00 = (string *)(pProperty + -0x42);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"<effect id=\"",0xc);
        XMLIDEncode((string *)local_5b0,name_00);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,(char *)local_5b0._0_8_,local_5b0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"-fx\" name=\"",0xb);
        XMLEscape(local_1a8,name_00);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\">",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
          operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
        }
        std::__cxx11::string::append((char *)psVar23);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"<profile_COMMON>",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)psVar23);
        local_5b0._0_8_ = local_5b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"emission","");
        WriteTextureParamEntry(this,(Surface *)(pProperty + -0x22),(string *)local_5b0,name_00);
        if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
          operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
        }
        local_5b0._0_8_ = local_5b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"ambient","");
        WriteTextureParamEntry(this,(Surface *)(pProperty + -0x3a),(string *)local_5b0,name_00);
        if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
          operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
        }
        local_5b0._0_8_ = local_5b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"diffuse","");
        local_5b8 = (Surface *)(pProperty + -0x32);
        WriteTextureParamEntry(this,local_5b8,(string *)local_5b0,name_00);
        if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
          operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
        }
        local_5b0._0_8_ = local_5b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"specular","");
        local_5c0 = (Surface *)(pProperty + -0x2a);
        WriteTextureParamEntry(this,local_5c0,(string *)local_5b0,name_00);
        if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
          operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
        }
        local_5b0._0_8_ = local_5b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"reflective","");
        local_5c8 = (Surface *)(pProperty + -0x1a);
        WriteTextureParamEntry(this,local_5c8,(string *)local_5b0,name_00);
        if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
          operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
        }
        local_5b0._0_8_ = local_5b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"transparent","");
        pSurface_00 = (Surface *)(pProperty + -0x12);
        WriteTextureParamEntry(this,pSurface_00,(string *)local_5b0,name_00);
        if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
          operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
        }
        local_5b0._0_8_ = local_5b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"normal","");
        pSurface = (Surface *)(pProperty + -10);
        WriteTextureParamEntry(this,pSurface,(string *)local_5b0,name_00);
        local_5d8 = pSurface;
        local_5d0 = pSurface_00;
        if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
          operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
        }
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,"<technique sid=\"standard\">",0x1a);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)psVar23);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"<",1);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,(char *)pProperty[-0x3e],(long)pProperty[-0x3d]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,">",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)psVar23);
        local_5b0._0_8_ = local_5b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"emission","");
        paVar2 = &local_1a8[0].field_2;
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_1a8);
        WriteTextureColorEntry(this,(Surface *)(pProperty + -0x22),(string *)local_5b0,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
          operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
        }
        local_5b0._0_8_ = local_5b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"ambient","");
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_1a8);
        WriteTextureColorEntry(this,(Surface *)(pProperty + -0x3a),(string *)local_5b0,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
          operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
        }
        local_5b0._0_8_ = local_5b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"diffuse","");
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_1a8);
        WriteTextureColorEntry(this,local_5b8,(string *)local_5b0,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
          operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
        }
        local_5b0._0_8_ = local_5b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"specular","");
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_1a8);
        WriteTextureColorEntry(this,local_5c0,(string *)local_5b0,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
          operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
        }
        local_5b0._0_8_ = local_5b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"shininess","");
        WriteFloatEntry(this,pProperty + -2,(string *)local_5b0);
        if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
          operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
        }
        local_5b0._0_8_ = local_5b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"reflective","");
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_1a8);
        WriteTextureColorEntry(this,local_5c8,(string *)local_5b0,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
          operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
        }
        local_5b0._0_8_ = local_5b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"transparent","");
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_1a8);
        WriteTextureColorEntry(this,local_5d0,(string *)local_5b0,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
          operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
        }
        local_5b0._0_8_ = local_5b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"transparency","");
        WriteFloatEntry(this,pProperty + -1,(string *)local_5b0);
        if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
          operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
        }
        local_5b0._0_8_ = local_5b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_5b0,"index_of_refraction","");
        WriteFloatEntry(this,pProperty,(string *)local_5b0);
        if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
          operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
        }
        if (pProperty[-6] != (Property)0x0) {
          local_5b0._0_8_ = local_5b0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"bump","");
          local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pProperty[-0x42],
                     (long)pProperty[-0x41] + (long)pProperty[-0x42]);
          std::__cxx11::string::append((char *)local_1a8);
          WriteTextureColorEntry(this,local_5d8,(string *)local_5b0,local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != paVar2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            local_1a8[0].field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
            operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
          }
        }
        PopTag(this);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"</",2);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,(char *)pProperty[-0x3e],(long)pProperty[-0x3d]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,">",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"</technique>",0xc);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"</profile_COMMON>",0x11);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"</effect>",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        pMVar26 = (pointer)(pProperty + 1);
        pProperty = pProperty + 0x43;
      } while (pMVar26 !=
               (this->materials).
               super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    PopTag(this);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                         (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"</library_effects>",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                         (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"<library_materials>",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    std::__cxx11::string::append((char *)psVar23);
    pMVar26 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pMVar26 !=
        (this->materials).
        super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"<material id=\"",0xe);
        XMLIDEncode((string *)local_5b0,&pMVar26->name);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,(char *)local_5b0._0_8_,local_5b0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" name=\"",8);
        XMLEscape(local_1a8,&pMVar26->name);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\">",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
          operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
        }
        std::__cxx11::string::append((char *)psVar23);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"<instance_effect url=\"#",0x17);
        XMLIDEncode((string *)local_5b0,&pMVar26->name);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,(char *)local_5b0._0_8_,local_5b0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"-fx\"/>",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
          operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
        }
        PopTag(this);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"</material>",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        pMVar26 = pMVar26 + 1;
      } while (pMVar26 !=
               (this->materials).
               super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    PopTag(this);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                         (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"</library_materials>",0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  }
  return;
}

Assistant:

void ColladaExporter::WriteMaterials()
{
  materials.resize( mScene->mNumMaterials);

  /// collect all materials from the scene
  size_t numTextures = 0;
  for( size_t a = 0; a < mScene->mNumMaterials; ++a )
  {
    const aiMaterial* mat = mScene->mMaterials[a];

    aiString name;
    if( mat->Get( AI_MATKEY_NAME, name) != aiReturn_SUCCESS ) {
      name = "mat";
      materials[a].name = std::string( "m") + to_string(a) + name.C_Str();
    } else {
      // try to use the material's name if no other material has already taken it, else append #
      std::string testName = name.C_Str();
      size_t materialCountWithThisName = 0;
      for( size_t i = 0; i < a; i ++ ) {
        if( materials[i].name == testName ) {
          materialCountWithThisName ++;
        }
      }
      if( materialCountWithThisName == 0 ) {
        materials[a].name = name.C_Str();
      } else {
        materials[a].name = std::string(name.C_Str()) + to_string(materialCountWithThisName);
      }
    }

    aiShadingMode shading = aiShadingMode_Flat;
    materials[a].shading_model = "phong";
    if(mat->Get( AI_MATKEY_SHADING_MODEL, shading) == aiReturn_SUCCESS) {
        if(shading == aiShadingMode_Phong) {
            materials[a].shading_model = "phong";
        } else if(shading == aiShadingMode_Blinn) {
            materials[a].shading_model = "blinn";
        } else if(shading == aiShadingMode_NoShading) {
            materials[a].shading_model = "constant";
        } else if(shading == aiShadingMode_Gouraud) {
            materials[a].shading_model = "lambert";
        }
    }

    ReadMaterialSurface( materials[a].ambient, mat, aiTextureType_AMBIENT, AI_MATKEY_COLOR_AMBIENT);
    if( !materials[a].ambient.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].diffuse, mat, aiTextureType_DIFFUSE, AI_MATKEY_COLOR_DIFFUSE);
    if( !materials[a].diffuse.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].specular, mat, aiTextureType_SPECULAR, AI_MATKEY_COLOR_SPECULAR);
    if( !materials[a].specular.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].emissive, mat, aiTextureType_EMISSIVE, AI_MATKEY_COLOR_EMISSIVE);
    if( !materials[a].emissive.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].reflective, mat, aiTextureType_REFLECTION, AI_MATKEY_COLOR_REFLECTIVE);
    if( !materials[a].reflective.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].transparent, mat, aiTextureType_OPACITY, AI_MATKEY_COLOR_TRANSPARENT);
    if( !materials[a].transparent.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].normal, mat, aiTextureType_NORMALS, NULL, 0, 0);
    if( !materials[a].normal.texture.empty() ) numTextures++;

    materials[a].shininess.exist = mat->Get( AI_MATKEY_SHININESS, materials[a].shininess.value) == aiReturn_SUCCESS;
    materials[a].transparency.exist = mat->Get( AI_MATKEY_OPACITY, materials[a].transparency.value) == aiReturn_SUCCESS;
    materials[a].index_refraction.exist = mat->Get( AI_MATKEY_REFRACTI, materials[a].index_refraction.value) == aiReturn_SUCCESS;
  }

  // output textures if present
  if( numTextures > 0 )
  {
    mOutput << startstr << "<library_images>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      WriteImageEntry( mat.ambient, mat.name + "-ambient-image");
      WriteImageEntry( mat.diffuse, mat.name + "-diffuse-image");
      WriteImageEntry( mat.specular, mat.name + "-specular-image");
      WriteImageEntry( mat.emissive, mat.name + "-emission-image");
      WriteImageEntry( mat.reflective, mat.name + "-reflective-image");
      WriteImageEntry( mat.transparent, mat.name + "-transparent-image");
      WriteImageEntry( mat.normal, mat.name + "-normal-image");
    }
    PopTag();
    mOutput << startstr << "</library_images>" << endstr;
  }

  // output effects - those are the actual carriers of information
  if( !materials.empty() )
  {
    mOutput << startstr << "<library_effects>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      // this is so ridiculous it must be right
      mOutput << startstr << "<effect id=\"" << XMLIDEncode(mat.name) << "-fx\" name=\"" << XMLEscape(mat.name) << "\">" << endstr;
      PushTag();
      mOutput << startstr << "<profile_COMMON>" << endstr;
      PushTag();

      // write sampler- and surface params for the texture entries
      WriteTextureParamEntry( mat.emissive, "emission", mat.name);
      WriteTextureParamEntry( mat.ambient, "ambient", mat.name);
      WriteTextureParamEntry( mat.diffuse, "diffuse", mat.name);
      WriteTextureParamEntry( mat.specular, "specular", mat.name);
      WriteTextureParamEntry( mat.reflective, "reflective", mat.name);
      WriteTextureParamEntry( mat.transparent, "transparent", mat.name);
      WriteTextureParamEntry( mat.normal, "normal", mat.name);

      mOutput << startstr << "<technique sid=\"standard\">" << endstr;
      PushTag();
      mOutput << startstr << "<" << mat.shading_model << ">" << endstr;
      PushTag();

      WriteTextureColorEntry( mat.emissive, "emission", mat.name + "-emission-sampler");
      WriteTextureColorEntry( mat.ambient, "ambient", mat.name + "-ambient-sampler");
      WriteTextureColorEntry( mat.diffuse, "diffuse", mat.name + "-diffuse-sampler");
      WriteTextureColorEntry( mat.specular, "specular", mat.name + "-specular-sampler");
      WriteFloatEntry(mat.shininess, "shininess");
      WriteTextureColorEntry( mat.reflective, "reflective", mat.name + "-reflective-sampler");
      WriteTextureColorEntry( mat.transparent, "transparent", mat.name + "-transparent-sampler");
      WriteFloatEntry(mat.transparency, "transparency");
      WriteFloatEntry(mat.index_refraction, "index_of_refraction");

      if(! mat.normal.texture.empty()) {
        WriteTextureColorEntry( mat.normal, "bump", mat.name + "-normal-sampler");
      }

      PopTag();
      mOutput << startstr << "</" << mat.shading_model << ">" << endstr;
      PopTag();
      mOutput << startstr << "</technique>" << endstr;
      PopTag();
      mOutput << startstr << "</profile_COMMON>" << endstr;
      PopTag();
      mOutput << startstr << "</effect>" << endstr;
    }
    PopTag();
    mOutput << startstr << "</library_effects>" << endstr;

    // write materials - they're just effect references
    mOutput << startstr << "<library_materials>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      mOutput << startstr << "<material id=\"" << XMLIDEncode(mat.name) << "\" name=\"" << XMLEscape(mat.name) << "\">" << endstr;
      PushTag();
      mOutput << startstr << "<instance_effect url=\"#" << XMLIDEncode(mat.name) << "-fx\"/>" << endstr;
      PopTag();
      mOutput << startstr << "</material>" << endstr;
    }
    PopTag();
    mOutput << startstr << "</library_materials>" << endstr;
  }
}